

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_data.cpp
# Opt level: O3

void __thiscall test_csr_data_size_Test::~test_csr_data_size_Test(test_csr_data_size_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_csr_data, size) {
  CSR_Data<Scalar> data{};
  EXPECT_EQ(size_row(data), 0);
  EXPECT_EQ(size_column(data), 0);
  EXPECT_EQ(size_non_zero(data), 0);

  resize(data, 7, 6);
  data.i_column.push_back(3);
  data.value.push_back(1.0);
  data.row_offset[8] = 1;  // add additional entry - show that non-zero increased.
  EXPECT_EQ(size_row(data), 7);
  EXPECT_EQ(size_column(data), 6);
  EXPECT_EQ(size_non_zero(data), 1);
}